

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cc
# Opt level: O1

index_t __thiscall xLearn::InmemReader::Samples(InmemReader *this,DMatrix **matrix)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  pointer puVar4;
  pointer puVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  
  uVar1 = this->num_samples_;
  if ((ulong)uVar1 != 0) {
    uVar2 = (this->data_buf_).row_length;
    uVar3 = this->pos_;
    uVar8 = 0;
    uVar7 = (ulong)(uVar2 - uVar3);
    if (uVar2 < uVar3) {
      uVar7 = uVar8;
    }
    do {
      if (uVar7 == uVar8) {
        if (uVar8 == 0) {
          if ((this->super_Reader).shuffle_ == true) {
            srand((this->super_Reader).seed_ + 1);
            puVar4 = (this->order_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            puVar5 = (this->order_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
            if ((puVar4 != puVar5) && (puVar4 + 1 != puVar5)) {
              lVar10 = 4;
              do {
                iVar6 = rand();
                lVar9 = (long)iVar6 % ((lVar10 >> 2) + 1);
                if (lVar10 != lVar9 * 4) {
                  uVar1 = *(uint *)((long)puVar4 + lVar10);
                  *(uint *)((long)puVar4 + lVar10) = puVar4[lVar9];
                  puVar4[lVar9] = uVar1;
                }
                lVar9 = lVar10 + 4;
                lVar10 = lVar10 + 4;
              } while ((pointer)((long)puVar4 + lVar9) != puVar5);
            }
          }
          *matrix = (DMatrix *)0x0;
          return 0;
        }
        break;
      }
      (this->super_Reader).data_samples_.row.
      super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar8] =
           (this->data_buf_).row.
           super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
           ._M_impl.super__Vector_impl_data._M_start
           [(this->order_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar3 + uVar8]];
      uVar2 = (this->order_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
              .super__Vector_impl_data._M_start[uVar3 + uVar8];
      (this->super_Reader).data_samples_.Y.super__Vector_base<float,_std::allocator<float>_>._M_impl
      .super__Vector_impl_data._M_start[uVar8] =
           (this->data_buf_).Y.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start[uVar2];
      (this->super_Reader).data_samples_.norm.super__Vector_base<float,_std::allocator<float>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar8] =
           (this->data_buf_).norm.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start[uVar2];
      this->pos_ = uVar3 + 1 + (int)uVar8;
      uVar8 = uVar8 + 1;
    } while (uVar1 != uVar8);
  }
  *matrix = &(this->super_Reader).data_samples_;
  return this->num_samples_;
}

Assistant:

index_t InmemReader::Samples(DMatrix* &matrix) {
  for (int i = 0; i < num_samples_; ++i) {
    if (pos_ >= data_buf_.row_length) {
      // End of the data buffer
      if (i == 0) {
        if (shuffle_) {
          srand(this->seed_+1);
          random_shuffle(order_.begin(), order_.end());
        }
        matrix = nullptr;
        return 0;
      }
      break;
    }
    // Copy data between different DMatrix.
    data_samples_.row[i] = data_buf_.row[order_[pos_]];
    data_samples_.Y[i] = data_buf_.Y[order_[pos_]];
    data_samples_.norm[i] = data_buf_.norm[order_[pos_]];
    pos_++;
  }
  matrix = &data_samples_;
  return num_samples_;
}